

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clhash.c
# Opt level: O0

__m128i mul128by128to128_lazymod127(__m128i A,__m128i B)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  __m128i Alow_00;
  ulong in_XMM0_Qa;
  ulong in_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong in_XMM1_Qa;
  ulong in_XMM1_Qb;
  __m128i alVar12;
  __m128i alVar13;
  __m128i Amix;
  __m128i Ahigh;
  __m128i Alow;
  __m128i Amix2;
  __m128i Amix1;
  ulong uStack_90;
  
  auVar11._8_8_ = 0;
  auVar11._0_8_ = in_XMM0_Qb;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_XMM1_Qa;
  auVar10 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar11 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar10 = auVar10 ^ auVar4 << uVar1;
    }
  }
  uStack_90 = auVar10._8_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_XMM0_Qa;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_XMM1_Qb;
  auVar11 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar11 = auVar11 ^ auVar6 << uVar1;
    }
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_XMM1_Qa;
  auVar4 = (undefined1  [16])0x0;
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
    if ((auVar2 & (undefined1  [16])0x1 << uVar1) != (undefined1  [16])0x0) {
      auVar4 = auVar4 ^ auVar3 << uVar1;
    }
  }
  for (uVar1 = 0; uVar1 < 0x40; uVar1 = uVar1 + 1) {
  }
  uVar7 = auVar10._0_8_ ^ auVar11._0_8_;
  uVar8 = uStack_90 ^ auVar11._8_8_;
  auVar10._8_8_ = uVar8;
  auVar10._0_8_ = uVar7;
  auVar10 = vpslldq_avx(auVar10,8);
  uStack_90 = auVar10._8_8_;
  auVar9._8_8_ = uVar8;
  auVar9._0_8_ = uVar7;
  auVar11 = vpsrldq_avx(auVar9,8);
  Alow_00[1] = auVar10._0_8_;
  Alow_00[0] = auVar11._8_8_;
  alVar12[1] = auVar11._0_8_;
  alVar12[0] = auVar4._8_8_ ^ uStack_90;
  alVar12 = lazymod127(Alow_00,alVar12);
  alVar13[0] = alVar12[0];
  alVar13[1] = alVar12[1];
  return alVar13;
}

Assistant:

static inline  __m128i mul128by128to128_lazymod127( __m128i A, __m128i B) {
    __m128i Amix1 = _mm_clmulepi64_si128(A,B,0x01);
    __m128i Amix2 = _mm_clmulepi64_si128(A,B,0x10);
    __m128i Alow = _mm_clmulepi64_si128(A,B,0x00);
    __m128i Ahigh = _mm_clmulepi64_si128(A,B,0x11);
    __m128i Amix = _mm_xor_si128(Amix1,Amix2);
    Amix1 = _mm_slli_si128(Amix,8);
    Amix2 = _mm_srli_si128(Amix,8);
    Alow = _mm_xor_si128(Alow,Amix1);
    Ahigh = _mm_xor_si128(Ahigh,Amix2);
    return lazymod127(Alow, Ahigh);
}